

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Wasm::WasmBytecodeGenerator::EmitBlockCommon
          (WasmBytecodeGenerator *this,BlockInfo *blockInfo,bool *endOnElse)

{
  bool bVar1;
  uint uVar2;
  FunctionBody *pFVar3;
  code *pcVar4;
  bool bVar5;
  WasmOp op;
  int iVar6;
  uint sourceContextId;
  WasmBinaryReader *pWVar7;
  PolymorphicEmitInfo PVar8;
  PolymorphicEmitInfo expectedTypes;
  uint local_50;
  PolymorphicEmitInfo info;
  
  EnsureStackAvailable(this);
  bVar1 = this->isUnreachable;
  EnterEvalStackScope(this,blockInfo);
  if (endOnElse != (bool *)0x0) {
    *endOnElse = false;
  }
  while( true ) {
    pWVar7 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
    if (pWVar7 == (WasmBinaryReader *)0x0) {
      pWVar7 = (this->m_module->m_reader).ptr;
    }
    iVar6 = (*(pWVar7->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
    op = (WasmOp)iVar6;
    if (op == wbEnd) goto LAB_00f309d9;
    if ((endOnElse != (bool *)0x0) && (op == wbElse)) break;
    EmitExpr(this,op);
  }
  *endOnElse = true;
LAB_00f309d9:
  pFVar3 = (this->m_funcInfo->m_body).ptr;
  if (pFVar3 == (FunctionBody *)0x0) {
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmBytecodePhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar3);
    pFVar3 = (this->m_funcInfo->m_body).ptr;
    if ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      info.field_1.infos = (EmitInfo *)__tls_get_addr(&PTR_0155fe48);
      ((info.field_1.infos)->super_EmitInfoBase).location = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      ((info.field_1.infos)->super_EmitInfoBase).location = 0;
    }
    bVar5 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,WasmBytecodePhase,sourceContextId,
                       ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
  }
  if (bVar5) {
    PrintOpBegin(this,op);
  }
  uVar2 = (blockInfo->yieldInfo).count;
  expectedTypes._0_8_ = (BlockInfo *)CONCAT44(0,uVar2);
  if (uVar2 != 0) {
    expectedTypes.field_1.infos = (blockInfo->yieldInfo).field_1.infos;
    PVar8 = PopStackPolymorphic(this,expectedTypes,(char16 *)0x0);
    info._0_8_ = PVar8.field_1;
    expectedTypes._0_8_ = (BlockInfo *)&local_50;
    local_50 = PVar8.count;
    PVar8._4_4_ = 0;
    PVar8.count = local_50;
    PVar8.field_1 =
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
    YieldToBlock(this,blockInfo,PVar8);
    ReleaseLocation(this,(PolymorphicEmitInfo *)expectedTypes._0_8_);
  }
  ExitEvalStackScope(this,expectedTypes._0_8_);
  if (bVar1 == false) {
    this->m_writer = this->m_originalWriter;
    this->isUnreachable = false;
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitBlockCommon(BlockInfo* blockInfo, bool* endOnElse /*= nullptr*/)
{
    EnsureStackAvailable();
    bool canResetUnreachable = !IsUnreachable();
    WasmOp op;
    EnterEvalStackScope(blockInfo);

    if(endOnElse) *endOnElse = false;
    do {
        op = GetReader()->ReadExpr();
        if (op == wbEnd)
        {
            break;
        }
        if (endOnElse && op == wbElse)
        {
            *endOnElse = true;
            break;
        }
        EmitExpr(op);
    } while (true);
    DebugPrintOp(op);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    ExitEvalStackScope(blockInfo);
    if (canResetUnreachable)
    {
        SetUnreachableState(false);
    }
}